

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_rs_generator.cc
# Opt level: O0

void __thiscall
t_rs_generator::render_struct_sync_write
          (t_rs_generator *this,t_struct *tstruct,e_struct_type struct_type)

{
  pointer *__return_storage_ptr__;
  t_field *tfield;
  bool bVar1;
  int iVar2;
  ostream *poVar3;
  undefined4 extraout_var;
  members_type *__x;
  reference pptVar4;
  string local_1d0;
  string local_1b0;
  string local_190;
  string local_170;
  undefined1 local_150 [8];
  string member_var;
  e_req member_req;
  t_field *member;
  t_field **local_118;
  __normal_iterator<t_field_**,_std::vector<t_field_*,_std::allocator<t_field_*>_>_> local_110;
  iterator members_iter;
  vector<t_field_*,_std::allocator<t_field_*>_> members;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b0;
  string local_90;
  string local_70;
  string local_40;
  e_struct_type local_1c;
  t_struct *ptStack_18;
  e_struct_type struct_type_local;
  t_struct *tstruct_local;
  t_rs_generator *this_local;
  
  local_1c = struct_type;
  ptStack_18 = tstruct;
  tstruct_local = (t_struct *)this;
  t_generator::indent_abi_cxx11_(&local_40,&this->super_t_generator);
  poVar3 = std::operator<<((ostream *)&this->f_gen_,(string *)&local_40);
  visibility_qualifier_abi_cxx11_(&local_70,this,local_1c);
  poVar3 = std::operator<<(poVar3,(string *)&local_70);
  poVar3 = std::operator<<(poVar3,
                           "fn write_to_out_protocol(&self, o_prot: &mut dyn TOutputProtocol) -> thrift::Result<()> {"
                          );
  std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
  std::__cxx11::string::~string((string *)&local_70);
  std::__cxx11::string::~string((string *)&local_40);
  t_generator::indent_up(&this->super_t_generator);
  t_generator::indent_abi_cxx11_(&local_90,&this->super_t_generator);
  poVar3 = std::operator<<((ostream *)&this->f_gen_,(string *)&local_90);
  iVar2 = (*(ptStack_18->super_t_type).super_t_doc._vptr_t_doc[3])();
  std::operator+(&local_d0,"let struct_ident = TStructIdentifier::new(\"",
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT44(extraout_var,iVar2));
  std::operator+(&local_b0,&local_d0,"\");");
  poVar3 = std::operator<<(poVar3,(string *)&local_b0);
  std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
  std::__cxx11::string::~string((string *)&local_b0);
  std::__cxx11::string::~string((string *)&local_d0);
  std::__cxx11::string::~string((string *)&local_90);
  __return_storage_ptr__ =
       &members.super__Vector_base<t_field_*,_std::allocator<t_field_*>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage;
  t_generator::indent_abi_cxx11_((string *)__return_storage_ptr__,&this->super_t_generator);
  poVar3 = std::operator<<((ostream *)&this->f_gen_,(string *)__return_storage_ptr__);
  poVar3 = std::operator<<(poVar3,"o_prot.write_struct_begin(&struct_ident)?;");
  std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
  std::__cxx11::string::~string
            ((string *)
             &members.super__Vector_base<t_field_*,_std::allocator<t_field_*>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  __x = t_struct::get_sorted_members(ptStack_18);
  std::vector<t_field_*,_std::allocator<t_field_*>_>::vector
            ((vector<t_field_*,_std::allocator<t_field_*>_> *)&members_iter,__x);
  bVar1 = std::vector<t_field_*,_std::allocator<t_field_*>_>::empty
                    ((vector<t_field_*,_std::allocator<t_field_*>_> *)&members_iter);
  if (!bVar1) {
    __gnu_cxx::__normal_iterator<t_field_**,_std::vector<t_field_*,_std::allocator<t_field_*>_>_>::
    __normal_iterator(&local_110);
    local_118 = (t_field **)
                std::vector<t_field_*,_std::allocator<t_field_*>_>::begin
                          ((vector<t_field_*,_std::allocator<t_field_*>_> *)&members_iter);
    local_110._M_current = local_118;
    while( true ) {
      member = (t_field *)
               std::vector<t_field_*,_std::allocator<t_field_*>_>::end
                         ((vector<t_field_*,_std::allocator<t_field_*>_> *)&members_iter);
      bVar1 = __gnu_cxx::operator!=
                        (&local_110,
                         (__normal_iterator<t_field_**,_std::vector<t_field_*,_std::allocator<t_field_*>_>_>
                          *)&member);
      if (!bVar1) break;
      pptVar4 = __gnu_cxx::
                __normal_iterator<t_field_**,_std::vector<t_field_*,_std::allocator<t_field_*>_>_>::
                operator*(&local_110);
      tfield = *pptVar4;
      member_var.field_2._12_4_ = actual_field_req(this,tfield,local_1c);
      rust_field_name_abi_cxx11_(&local_170,this,tfield);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_150,
                     "self.",&local_170);
      std::__cxx11::string::~string((string *)&local_170);
      render_struct_field_sync_write
                (this,(string *)local_150,false,tfield,member_var.field_2._12_4_);
      std::__cxx11::string::~string((string *)local_150);
      __gnu_cxx::__normal_iterator<t_field_**,_std::vector<t_field_*,_std::allocator<t_field_*>_>_>
      ::operator++(&local_110);
    }
  }
  t_generator::indent_abi_cxx11_(&local_190,&this->super_t_generator);
  poVar3 = std::operator<<((ostream *)&this->f_gen_,(string *)&local_190);
  poVar3 = std::operator<<(poVar3,"o_prot.write_field_stop()?;");
  std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
  std::__cxx11::string::~string((string *)&local_190);
  t_generator::indent_abi_cxx11_(&local_1b0,&this->super_t_generator);
  poVar3 = std::operator<<((ostream *)&this->f_gen_,(string *)&local_1b0);
  poVar3 = std::operator<<(poVar3,"o_prot.write_struct_end()");
  std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
  std::__cxx11::string::~string((string *)&local_1b0);
  t_generator::indent_down(&this->super_t_generator);
  t_generator::indent_abi_cxx11_(&local_1d0,&this->super_t_generator);
  poVar3 = std::operator<<((ostream *)&this->f_gen_,(string *)&local_1d0);
  poVar3 = std::operator<<(poVar3,"}");
  std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
  std::__cxx11::string::~string((string *)&local_1d0);
  std::vector<t_field_*,_std::allocator<t_field_*>_>::~vector
            ((vector<t_field_*,_std::allocator<t_field_*>_> *)&members_iter);
  return;
}

Assistant:

void t_rs_generator::render_struct_sync_write(
    t_struct *tstruct,
    t_rs_generator::e_struct_type struct_type
) {
  f_gen_
    << indent()
    << visibility_qualifier(struct_type)
    << "fn write_to_out_protocol(&self, o_prot: &mut dyn TOutputProtocol) -> thrift::Result<()> {"
    << endl;
  indent_up();

  // write struct header to output protocol
  // note: use the *original* struct name here
  f_gen_ << indent() << "let struct_ident = TStructIdentifier::new(\"" + tstruct->get_name() + "\");" << endl;
  f_gen_ << indent() << "o_prot.write_struct_begin(&struct_ident)?;" << endl;

  // write struct members to output protocol
  vector<t_field*> members = tstruct->get_sorted_members();
  if (!members.empty()) {
    vector<t_field*>::iterator members_iter;
    for(members_iter = members.begin(); members_iter != members.end(); ++members_iter) {
      t_field* member = (*members_iter);
      t_field::e_req member_req = actual_field_req(member, struct_type);
      string member_var("self." + rust_field_name(member));
      render_struct_field_sync_write(member_var, false, member, member_req);
    }
  }

  // write struct footer to output protocol
  f_gen_ << indent() << "o_prot.write_field_stop()?;" << endl;
  f_gen_ << indent() << "o_prot.write_struct_end()" << endl;

  indent_down();
  f_gen_ << indent() << "}" << endl;
}